

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall gl4cts::GPUShaderFP64Test4::_data::_data(_data *this)

{
  this->uniform_double = 0.0;
  memset(this->uniform_dvec2,0,0xd8);
  this->uniform_location_double = -1;
  this->uniform_location_double_arr[0] = -1;
  this->uniform_location_double_arr[1] = -1;
  this->uniform_location_dvec2 = -1;
  this->uniform_location_dvec2_arr[0] = -1;
  this->uniform_location_dvec2_arr[1] = -1;
  this->uniform_location_dvec3 = -1;
  this->uniform_location_dvec3_arr[0] = -1;
  this->uniform_location_dvec3_arr[1] = -1;
  this->uniform_location_dvec4 = -1;
  this->uniform_location_dvec4_arr[0] = -1;
  this->uniform_location_dvec4_arr[1] = -1;
  return;
}

Assistant:

GPUShaderFP64Test4::_data::_data()
{
	memset(&uniform_double, 0, sizeof(uniform_double));
	memset(uniform_dvec2, 0, sizeof(uniform_dvec2));
	memset(uniform_dvec2_arr, 0, sizeof(uniform_dvec2_arr));
	memset(uniform_dvec3, 0, sizeof(uniform_dvec3));
	memset(uniform_dvec3_arr, 0, sizeof(uniform_dvec3_arr));
	memset(uniform_dvec4, 0, sizeof(uniform_dvec4));
	memset(uniform_dvec4_arr, 0, sizeof(uniform_dvec4_arr));

	uniform_location_double		   = -1;
	uniform_location_double_arr[0] = -1;
	uniform_location_double_arr[1] = -1;
	uniform_location_dvec2		   = -1;
	uniform_location_dvec2_arr[0]  = -1;
	uniform_location_dvec2_arr[1]  = -1;
	uniform_location_dvec3		   = -1;
	uniform_location_dvec3_arr[0]  = -1;
	uniform_location_dvec3_arr[1]  = -1;
	uniform_location_dvec4		   = -1;
	uniform_location_dvec4_arr[0]  = -1;
	uniform_location_dvec4_arr[1]  = -1;
}